

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

object __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Point<3L>_>::get
          (PythonDataType<anurbs::Model,_anurbs::Point<3L>_> *this,Model *model,string *key)

{
  handle hVar1;
  string *in_RCX;
  undefined1 auStack_48 [48];
  
  std::__cxx11::string::string((string *)(auStack_48 + 0x10),in_RCX);
  Model::get<anurbs::Point<3l>>((Model *)auStack_48,key);
  hVar1 = pybind11::detail::type_caster_base<anurbs::Ref<anurbs::Point<3L>_>_>::cast
                    ((itype *)auStack_48,copy,(handle)0x0);
  (this->super_PythonDataTypeBase<anurbs::Model>)._vptr_PythonDataTypeBase =
       (_func_int **)hVar1.m_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_48 + 8));
  std::__cxx11::string::~string((string *)(auStack_48 + 0x10));
  return (object)(handle)this;
}

Assistant:

pybind11::object get(const TModel& model, const std::string& key)
        override
    {
        return pybind11::cast(model.template get<TData>(key));
    }